

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmViewTraceImage::Write(ON_3dmViewTraceImage *this,ON_BinaryArchive *file)

{
  int iVar1;
  uint minor_version_00;
  ON_wString *s;
  bool local_1d;
  bool rc;
  int minor_version;
  ON_BinaryArchive *file_local;
  ON_3dmViewTraceImage *this_local;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(file);
  minor_version_00 = 3;
  if (0x3b < iVar1) {
    minor_version_00 = 4;
  }
  local_1d = ON_BinaryArchive::Write3dmChunkVersion(file,1,minor_version_00);
  if (local_1d) {
    if (local_1d) {
      s = ON_FileReference::FullPath(&this->m_image_file_reference);
      local_1d = ON_BinaryArchive::WriteString(file,s);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_width);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_height);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WritePlane(file,&this->m_plane);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bGrayScale & 1));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bHidden & 1));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bFiltered & 1));
    }
    if (((local_1d != false) && (3 < minor_version_00)) && (local_1d != false)) {
      local_1d = ON_FileReference::Write(&this->m_image_file_reference,true,file);
    }
  }
  return local_1d;
}

Assistant:

bool ON_3dmViewTraceImage::Write( ON_BinaryArchive& file ) const
{
  // opennurbs version  < 200307300 - version 1.0 or 1.1 chunk
  // opennurbs version >= 200307300 - version 1.2 chunk
  const int minor_version = (file.Archive3dmVersion() >= 60) ? 4 : 3;
  bool rc = file.Write3dmChunkVersion(1,minor_version);
  if (rc) 
  {
    if (rc) rc = file.WriteString( m_image_file_reference.FullPath() );
    if (rc) rc = file.WriteDouble( m_width );
    if (rc) rc = file.WriteDouble( m_height );
    if (rc) rc = file.WritePlane( m_plane );

    // version 1.1
    if (rc) rc = file.WriteBool( m_bGrayScale );

    // version 1.2
    if (rc) rc = file.WriteBool( m_bHidden );
    
    // version 1.3
    if (rc) rc = file.WriteBool( m_bFiltered );

    if (rc && minor_version >= 4)
    {
      // version 1.4
      if (rc) rc = m_image_file_reference.Write(true, file);
    }
  }
  return rc;
}